

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

ptrdiff_t __thiscall
google::protobuf::io::EpsCopyOutputStream::GetSize(EpsCopyOutputStream *this,uint8_t *ptr)

{
  LogMessage *other;
  uint8_t *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  puVar1 = this->end_;
  if (puVar1 + 0x10 < ptr) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x358);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: ptr <= end_ + kSlopBytes: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    puVar1 = this->end_;
  }
  return (ptrdiff_t)(puVar1 + (0x10 - (long)ptr));
}

Assistant:

std::ptrdiff_t GetSize(uint8_t* ptr) const {
    GOOGLE_DCHECK(ptr <= end_ + kSlopBytes);  // NOLINT
    return end_ + kSlopBytes - ptr;
  }